

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver_query.hpp
# Opt level: O0

void __thiscall
asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
          (basic_resolver_query<asio::ip::tcp> *this,string *host,string *service,
          flags resolve_flags)

{
  int iVar1;
  undefined4 in_ECX;
  string *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  endpoint endpoint;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  tcp local_50;
  tcp local_4c [12];
  undefined4 local_1c;
  string *local_18;
  
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)(in_RDI + 6),in_RSI);
  std::__cxx11::string::string((string *)(in_RDI + 10),local_18);
  basic_endpoint<asio::ip::tcp>::basic_endpoint((basic_endpoint<asio::ip::tcp> *)0x12330a);
  *(undefined4 *)in_RDI = local_1c;
  *(undefined4 *)((long)in_RDI + 4) = 0;
  local_4c[0].family_ =
       (int)basic_endpoint<asio::ip::tcp>::protocol
                      ((basic_endpoint<asio::ip::tcp> *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  iVar1 = tcp::type(local_4c);
  *(int *)(in_RDI + 1) = iVar1;
  local_50.family_ =
       (int)basic_endpoint<asio::ip::tcp>::protocol
                      ((basic_endpoint<asio::ip::tcp> *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  iVar1 = tcp::protocol(&local_50);
  *(int *)((long)in_RDI + 0xc) = iVar1;
  *(undefined4 *)(in_RDI + 2) = 0;
  in_RDI[4] = 0;
  in_RDI[3] = 0;
  in_RDI[5] = 0;
  return;
}

Assistant:

basic_resolver_query(const std::string& host, const std::string& service,
      resolver_query_base::flags resolve_flags = address_configured)
    : hints_(),
      host_name_(host),
      service_name_(service)
  {
    typename InternetProtocol::endpoint endpoint;
    hints_.ai_flags = static_cast<int>(resolve_flags);
    hints_.ai_family = ASIO_OS_DEF(AF_UNSPEC);
    hints_.ai_socktype = endpoint.protocol().type();
    hints_.ai_protocol = endpoint.protocol().protocol();
    hints_.ai_addrlen = 0;
    hints_.ai_canonname = 0;
    hints_.ai_addr = 0;
    hints_.ai_next = 0;
  }